

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageSizeBase::SupportedSamples
          (ShaderImageSizeBase *this,int required)

{
  int iVar1;
  ostream *poVar2;
  int i;
  string local_1b0;
  ostringstream reason;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x906d,&i);
  iVar1 = i;
  if (i < 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&reason);
    poVar2 = std::operator<<((ostream *)&reason,"Required ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
    poVar2 = std::operator<<(poVar2," image samples but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
    poVar2 = std::operator<<(poVar2," available.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&reason);
  }
  return 3 < iVar1;
}

Assistant:

bool SupportedSamples(int required)
	{
		int i;
		glGetIntegerv(GL_MAX_IMAGE_SAMPLES, &i);
		if (i >= required)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << required << " image samples but only " << i << " available." << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}